

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O3

bool anon_unknown.dwarf_14840c2::IsAsciiSTL(char *buffer,uint fileSize)

{
  int iVar1;
  byte *__s1;
  ulong uVar2;
  bool bVar3;
  
  __s1 = (byte *)buffer;
  if ((0x53 < fileSize) && (*(int *)(buffer + 0x50) * 0x32 + 0x54U == fileSize)) {
    return false;
  }
  do {
    uVar2 = (ulong)*__s1;
    if (0x20 < uVar2) {
LAB_005fa292:
      if (__s1 + 5 < buffer + fileSize) {
        iVar1 = strncmp((char *)__s1,"solid",5);
        bVar3 = iVar1 == 0;
      }
      else {
LAB_005fa28b:
        bVar3 = false;
      }
      return bVar3;
    }
    if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) goto LAB_005fa28b;
      goto LAB_005fa292;
    }
    __s1 = __s1 + 1;
  } while( true );
}

Assistant:

static bool IsBinarySTL(const char* buffer, unsigned int fileSize) {
    if( fileSize < 84 ) {
        return false;
    }

    const char *facecount_pos = buffer + 80;
    uint32_t faceCount( 0 );
    ::memcpy( &faceCount, facecount_pos, sizeof( uint32_t ) );
    const uint32_t expectedBinaryFileSize = faceCount * 50 + 84;

    return expectedBinaryFileSize == fileSize;
}